

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O1

void __thiscall
wasm::
Walker<wasm::(anonymous_namespace)::Unsubtyping,_wasm::SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping>_>
::walkModule(Walker<wasm::(anonymous_namespace)::Unsubtyping,_wasm::SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping>_>
             *this,Module *module)

{
  Unsubtyping *this_00;
  pointer puVar1;
  Function *pFVar2;
  pointer puVar3;
  Global *pGVar4;
  Expression *pEVar5;
  ElementSegment *pEVar6;
  pointer ppEVar7;
  pointer puVar8;
  pointer puVar9;
  Module *pMVar10;
  Walker<wasm::(anonymous_namespace)::Unsubtyping,_wasm::SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping>_>
  *pWVar11;
  mapped_type *pmVar12;
  _Rb_tree_node_base *p_Var13;
  Table *pTVar14;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar15;
  _Base_ptr p_Var16;
  _Base_ptr p_Var17;
  pointer ppEVar18;
  HeapType sub;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *seg;
  pointer puVar19;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *curr;
  pointer puVar20;
  pointer puVar21;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *global;
  PassRunner local_330;
  undefined1 local_240 [336];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  Module *local_e0;
  ParallelFunctionAnalysis<wasm::(anonymous_namespace)::Unsubtyping,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
  analysis;
  _List_node_base *local_98;
  undefined1 local_88 [32];
  undefined8 local_68;
  undefined8 uStack_60;
  code *local_58;
  code *pcStack_50;
  Module *local_48;
  Module *local_40;
  Walker<wasm::(anonymous_namespace)::Unsubtyping,_wasm::SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping>_>
  *local_38;
  
  this->currModule = module;
  local_68 = &stack0xffffffffffffffb8;
  uStack_60 = 0;
  pcStack_50 = std::
               _Function_handler<void_(wasm::Function_*,_wasm::(anonymous_namespace)::Unsubtyping_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Unsubtyping.cpp:349:14)>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(wasm::Function_*,_wasm::(anonymous_namespace)::Unsubtyping_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Unsubtyping.cpp:349:14)>
             ::_M_manager;
  analysis._24_8_ = &analysis.field_0x8;
  analysis._8_4_ = 0;
  analysis._16_8_ = 0;
  analysis._40_8_ = 0;
  puVar15 = (module->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_e0 = module;
  analysis._32_8_ = analysis._24_8_;
  local_48 = module;
  local_38 = this;
  if (puVar15 != puVar1) {
    do {
      local_240._0_8_ =
           (puVar15->_M_t).
           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
           super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      std::
      map<wasm::Function_*,_wasm::(anonymous_namespace)::Unsubtyping,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::Unsubtyping>_>_>
      ::operator[]((map<wasm::Function_*,_wasm::(anonymous_namespace)::Unsubtyping,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::Unsubtyping>_>_>
                    *)&analysis,(key_type *)local_240);
      puVar15 = puVar15 + 1;
    } while (puVar15 != puVar1);
  }
  std::function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::Unsubtyping_&)>::function
            ((function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::Unsubtyping_&)> *)
             local_88,(function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::Unsubtyping_&)>
                       *)&stack0xffffffffffffff98);
  puVar15 = (local_e0->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (local_e0->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar15 != puVar1) {
    do {
      pFVar2 = (puVar15->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if (*(char **)((long)&(pFVar2->super_Importable).module + 8) != (char *)0x0) {
        local_330._vptr_PassRunner = (_func_int **)pFVar2;
        pmVar12 = std::
                  map<wasm::Function_*,_wasm::(anonymous_namespace)::Unsubtyping,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::Unsubtyping>_>_>
                  ::operator[]((map<wasm::Function_*,_wasm::(anonymous_namespace)::Unsubtyping,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::Unsubtyping>_>_>
                                *)&analysis,(key_type *)&local_330);
        local_240._0_8_ = pFVar2;
        if ((pointer)local_88._16_8_ == (pointer)0x0) {
          std::__throw_bad_function_call();
        }
        (*(code *)local_88._24_8_)(local_88,local_240,pmVar12);
      }
      puVar15 = puVar15 + 1;
    } while (puVar15 != puVar1);
  }
  pMVar10 = local_e0;
  local_330.options.arguments._M_h._M_buckets = &local_330.options.arguments._M_h._M_single_bucket;
  local_330._vptr_PassRunner = (_func_int **)&PTR__PassRunner_01091270;
  local_330.wasm = local_e0;
  local_330.allocator = &local_e0->allocator;
  local_330.passes.
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_330.passes.
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_330.passes.
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_330.passes.
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_330._41_8_ = 0;
  local_330.options.validate = true;
  local_330.options.validateGlobally = true;
  local_330.options.optimizeLevel = 0;
  local_330.options.shrinkLevel = 0;
  local_330.options.inlining.alwaysInlineMaxSize = 2;
  local_330.options.inlining.oneCallerInlineMaxSize = 0xffffffff;
  local_330.options.inlining.flexibleInlineMaxSize = 0x14;
  local_330.options.inlining.allowFunctionsWithLoops = false;
  local_330.options.printStackIR.
  super__Optional_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_true,_true>._M_payload.
  super__Optional_payload_base<std::basic_ostream<char,_std::char_traits<char>_>_*>._M_engaged =
       false;
  local_330.options.targetJS = false;
  local_330.options.inlining.partialInliningIfs = 0;
  local_330.options.ignoreImplicitTraps = false;
  local_330.options.trapsNeverHappen = false;
  local_330.options.lowMemoryUnused = false;
  local_330.options.fastMath = false;
  local_330.options.zeroFilledMemory = false;
  local_330.options.closedWorld = false;
  local_330.options.debugInfo = false;
  local_330.options.generateStackIR = false;
  local_330.options.optimizeStackIR = false;
  local_330.options.arguments._M_h._M_bucket_count = 1;
  local_330.options.arguments._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_330.options.arguments._M_h._M_element_count = 0;
  local_330.options.arguments._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_330.options.arguments._M_h._M_rehash_policy._M_next_resize = 0;
  local_330.options.arguments._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_330.options.passesToSkip._M_h._M_buckets =
       &local_330.options.passesToSkip._M_h._M_single_bucket;
  local_330.options.passesToSkip._M_h._M_bucket_count = 1;
  local_330.options.passesToSkip._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_330.options.passesToSkip._M_h._M_element_count = 0;
  local_330.options.passesToSkip._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_330.options.passesToSkip._M_h._M_rehash_policy._M_next_resize = 0;
  local_330.options.passesToSkip._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_330.isNested = false;
  local_330.addedPassesRemovedDWARF = false;
  std::function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::Unsubtyping_&)>::function
            ((function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::Unsubtyping_&)> *)
             &analysis.field_0x30,
             (function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::Unsubtyping_&)> *)
             local_88);
  wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::Unsubtyping,(wasm::
  Mutability)0,wasm::ModuleUtils::DefaultMap>::doAnalysis(std::function<void(wasm::Function*,wasm::
  (anonymous_namespace)::Unsubtyping&)>)::Mapper::Mapper(wasm::Module&,std::map<wasm::Function*,wasm
  ::(anonymous_namespace)::Unsubtyping,std::less<wasm::Function*>,std::allocator<std::pair<wasm::
  Function*const,wasm::(anonymous_namespace)::Unsubtyping>>>&,std::function<void(wasm::
  Function*,wasm::(anonymous)::Unsubtyping__>_
            (local_240,pMVar10,(Map *)&analysis,(Func *)&analysis.field_0x30);
  if ((PassRunner *)local_240._8_8_ != &local_330 &&
      (PassRunner *)local_240._8_8_ != (PassRunner *)0x0) {
    __assert_fail("(!runner || runner == runner_) && \"Pass already had a runner\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/pass.h"
                  ,0x1dd,"void wasm::Pass::setPassRunner(PassRunner *)");
  }
  sub.id = (uintptr_t)local_e0;
  local_240._8_8_ = &local_330;
  (**(code **)&(((Importable *)local_240._0_8_)->super_Named).hasExplicitName)();
  local_240._0_8_ = &PTR__Mapper_01096708;
  if ((code *)local_f0._M_allocated_capacity != (code *)0x0) {
    sub.id = (uintptr_t)(local_240 + 0x140);
    (*(code *)local_f0._M_allocated_capacity)(sub.id,sub.id,3);
  }
  if ((pointer)local_240._264_8_ != (pointer)0x0) {
    sub.id = local_240._280_8_ - local_240._264_8_;
    operator_delete((void *)local_240._264_8_,sub.id);
  }
  Pass::~Pass((Pass *)local_240);
  if (local_98 != (_List_node_base *)0x0) {
    sub.id = (uintptr_t)&analysis.field_0x30;
    (*(code *)local_98)(sub.id,sub.id,3);
  }
  PassRunner::~PassRunner(&local_330);
  if ((pointer)local_88._16_8_ != (pointer)0x0) {
    sub.id = (uintptr_t)local_88;
    (*(code *)local_88._16_8_)(sub.id,sub.id,3);
  }
  if ((pointer)local_58 != (pointer)0x0) {
    sub.id = (uintptr_t)&stack0xffffffffffffff98;
    (*local_58)(sub.id,sub.id,3);
  }
  this_00 = (Unsubtyping *)(local_38[-1].stack.fixed._M_elems + 7);
  for (p_Var13 = (_Rb_tree_node_base *)analysis._24_8_;
      p_Var13 != (_Rb_tree_node_base *)&analysis.field_0x8;
      p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
    p_Var16 = (_Base_ptr)&p_Var13[0xe]._M_right;
    while (p_Var16 = *(_Base_ptr *)p_Var16, p_Var16 != (_Base_ptr)0x0) {
      sub.id = (uintptr_t)p_Var16->_M_parent;
      anon_unknown_22::Unsubtyping::noteSubtype(this_00,sub,(HeapType)p_Var16->_M_left);
    }
    for (p_Var16 = p_Var13[0x10]._M_left; p_Var16 != (_Base_ptr)0x0; p_Var16 = *(_Base_ptr *)p_Var16
        ) {
      p_Var17 = p_Var16 + 1;
      while (p_Var17 = *(_Base_ptr *)p_Var17, p_Var17 != (_Base_ptr)0x0) {
        sub.id = (uintptr_t)p_Var16->_M_parent;
        anon_unknown_22::Unsubtyping::noteCast(this_00,sub,(HeapType)p_Var17->_M_parent);
      }
    }
  }
  puVar3 = (local_48->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar20 = (local_48->globals).
                 super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar20 != puVar3; puVar20 = puVar20 + 1
      ) {
    pGVar4 = (puVar20->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
             ._M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
             super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
    pEVar5 = pGVar4->init;
    if (pEVar5 != (Expression *)0x0) {
      sub.id = (pEVar5->type).id;
      anon_unknown_22::Unsubtyping::noteSubtype(this_00,(Type)sub.id,(Type)(pGVar4->type).id);
    }
  }
  puVar19 = (local_48->elementSegments).
            super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_40 = (Module *)
             (local_48->elementSegments).
             super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if ((Module *)puVar19 != local_40) {
    do {
      pEVar6 = (puVar19->_M_t).
               super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
               .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
      if (pEVar6->offset != (Expression *)0x0) {
        sub.id = (pEVar6->type).id;
        pTVar14 = Module::getTable(local_38->currModule,(Name)(pEVar6->table).super_IString.str);
        anon_unknown_22::Unsubtyping::noteSubtype(this_00,(Type)sub.id,(Type)(pTVar14->type).id);
      }
      ppEVar7 = *(pointer *)
                 ((long)&(pEVar6->data).
                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                 + 8);
      for (ppEVar18 = *(pointer *)
                       &(pEVar6->data).
                        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                        _M_impl; ppEVar18 != ppEVar7; ppEVar18 = ppEVar18 + 1) {
        sub.id = ((*ppEVar18)->type).id;
        anon_unknown_22::Unsubtyping::noteSubtype(this_00,(Type)sub.id,(Type)(pEVar6->type).id);
      }
      puVar19 = puVar19 + 1;
    } while ((Module *)puVar19 != local_40);
  }
  pMVar10 = local_48;
  local_38->currModule = local_48;
  puVar3 = (local_48->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar20 = (local_48->globals).
                 super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar20 != puVar3; puVar20 = puVar20 + 1
      ) {
    sub.id = (uintptr_t)
             (puVar20->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
             ._M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
             super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
    if (*(Expression **)&((Importable *)((long)&((Module *)sub.id)->functions + 8))->super_Named ==
        (Expression *)0x0) {
      sub.id = (long)&((Module *)sub.id)->globals + 0x10;
      walk(local_38,(Expression **)sub.id);
    }
  }
  puVar19 = (pMVar10->elementSegments).
            super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_40 = pMVar10;
  puVar8 = (pMVar10->elementSegments).
           super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar19 != puVar8) {
    do {
      sub.id = (uintptr_t)
               (puVar19->_M_t).
               super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
               .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
      if (*(long *)&((Name *)((long)&((Module *)sub.id)->functions + 0x10))->super_IString != 0) {
        sub.id = (long)&((Module *)sub.id)->functions + 0x10;
        walk(local_38,(Expression **)sub.id);
      }
      pEVar6 = (puVar19->_M_t).
               super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
               .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
      ppEVar7 = *(pointer *)
                 ((long)&(pEVar6->data).
                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                 + 8);
      for (ppEVar18 = *(pointer *)
                       &(pEVar6->data).
                        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                        _M_impl; ppEVar18 != ppEVar7; ppEVar18 = ppEVar18 + 1) {
        local_240._0_8_ = *ppEVar18;
        sub.id = (uintptr_t)local_240;
        walk(local_38,(Expression **)local_240);
      }
      puVar19 = puVar19 + 1;
    } while (puVar19 != puVar8);
  }
  puVar9 = (local_40->dataSegments).
           super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar21 = (local_40->dataSegments).
                 super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pWVar11 = local_38, puVar21 != puVar9;
      puVar21 = puVar21 + 1) {
    sub.id = (uintptr_t)
             (puVar21->_M_t).
             super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
             super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
             super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
    if (*(Expression **)
         &(((Module *)sub.id)->globals).
          super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
        != (Expression *)0x0) {
      sub.id = (uintptr_t)&((Module *)sub.id)->globals;
      walk(local_38,(Expression **)sub.id);
    }
  }
  local_38->currModule = (Module *)0x0;
  std::
  _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::Unsubtyping>,_std::_Select1st<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::Unsubtyping>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::Unsubtyping>_>_>
  ::_M_erase((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::Unsubtyping>,_std::_Select1st<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::Unsubtyping>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::Unsubtyping>_>_>
              *)analysis._16_8_,(_Link_type)sub.id);
  pWVar11->currModule = (Module *)0x0;
  return;
}

Assistant:

void walkModule(Module* module) {
    setModule(module);
    static_cast<SubType*>(this)->doWalkModule(module);
    static_cast<SubType*>(this)->visitModule(module);
    setModule(nullptr);
  }